

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_TestShell::createTest
          (TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_TestShell
           *this)

{
  TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x11e);
  TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test::
  TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, TwoSetsOfIdenticalSequences_SameFourSequences)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TwoSetsOfIdenticalSequences));
}